

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
::clear(sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *this)

{
  if (this->num_deleted != 0 || (this->table).settings.num_buckets != 0) {
    sparsetable<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::clear(&this->table);
  }
  sparsehash_internal::sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4> *)this,
                   (this->table).settings.table_size);
  this->num_deleted = 0;
  return;
}

Assistant:

void clear() {
    if (!empty() || (num_deleted != 0)) {
      table.clear();
    }
    settings.reset_thresholds(bucket_count());
    num_deleted = 0;
  }